

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_p.h
# Opt level: O1

bool __thiscall QThreadData::canWaitLocked(QThreadData *this)

{
  QMutex *this_00;
  QMutex *pQVar1;
  __pointer_type copy;
  bool bVar2;
  
  this_00 = &(this->postEventList).mutex;
  if ((this->postEventList).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0)
  {
    LOCK();
    bVar2 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_003cebcc;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_003cebcc:
  bVar2 = this->canWait;
  LOCK();
  pQVar1 = &(this->postEventList).mutex;
  copy = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  return bVar2;
}

Assistant:

bool canWaitLocked()
    {
        QMutexLocker locker(&postEventList.mutex);
        return canWait;
    }